

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nu,int nv,Bounds2f domain,
          Allocator alloc)

{
  reference this_00;
  int in_ECX;
  Tuple2<pbrt::Point2,_float> *in_RDI;
  int in_R8D;
  PiecewiseConstant1D *in_R9;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  span<const_float> sVar1;
  int v_1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> marginalFunc;
  int v;
  size_t vb;
  size_t va;
  PiecewiseConstant1D *in_stack_fffffffffffffe68;
  PiecewiseConstant1D *in_stack_fffffffffffffe70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffe78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int iVar2;
  undefined4 in_stack_fffffffffffffe8c;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *in_stack_fffffffffffffe90;
  PiecewiseConstant1D *in_stack_fffffffffffffeb8;
  Allocator in_stack_fffffffffffffec0;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *this_01;
  polymorphic_allocator<pbrt::PiecewiseConstant1D> *alloc_00;
  LogLevel level;
  char (*in_stack_fffffffffffffef0) [12];
  unsigned_long *in_stack_fffffffffffffef8;
  char (*in_stack_ffffffffffffff00) [24];
  unsigned_long *in_stack_ffffffffffffff08;
  int local_ac;
  polymorphic_allocator<float> local_a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a0;
  span<const_float> local_80;
  int local_6c;
  size_t local_68;
  size_t local_60;
  Float in_stack_ffffffffffffffb0;
  Float in_stack_ffffffffffffffb4;
  polymorphic_allocator<pbrt::PiecewiseConstant1D> in_stack_ffffffffffffffc0;
  Tuple2<pbrt::Point2,_float> *pTVar3;
  Tuple2<pbrt::Point2,_float> local_20;
  Tuple2<pbrt::Point2,_float> TStack_18;
  span<const_float> local_10;
  
  local_20 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  TStack_18 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  *in_RDI = local_20;
  in_RDI[1] = TStack_18;
  this_01 = (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
             *)(in_RDI + 2);
  alloc_00 = (polymorphic_allocator<pbrt::PiecewiseConstant1D> *)&stack0xffffffffffffffc0;
  pTVar3 = in_RDI;
  pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)in_stack_fffffffffffffe70,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe68);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  vector(this_01,alloc_00);
  iVar2 = (int)((ulong)alloc_00 >> 0x20);
  level = (LogLevel)((ulong)(in_RDI + 6) >> 0x20);
  PiecewiseConstant1D::PiecewiseConstant1D(in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
  local_60 = pstd::span<const_float>::size(&local_10);
  local_68 = (long)in_ECX * (long)in_R8D;
  if (local_60 != local_68) {
    LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
              (level,(char *)in_RDI,iVar2,(char *)this_01,
               (char (*) [12])in_stack_fffffffffffffec0.memoryResource,
               (char (*) [24])in_stack_fffffffffffffeb8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  }
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  reserve(in_stack_fffffffffffffe90,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  for (local_6c = 0; local_6c < in_R8D; local_6c = local_6c + 1) {
    sVar1 = pstd::span<const_float>::subspan
                      ((span<const_float> *)in_stack_fffffffffffffe90,
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (size_t)in_stack_fffffffffffffe80);
    local_80 = sVar1;
    Tuple2<pbrt::Point2,_float>::operator[](&local_20,0);
    Tuple2<pbrt::Point2,_float>::operator[](&TStack_18,0);
    pstd::
    vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>::
    emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (in_stack_fffffffffffffe90,
               (span<const_float> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (float *)in_stack_fffffffffffffe80,(float *)in_stack_fffffffffffffe78,
               (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe70);
  }
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffe70);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_a0,&local_a8);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffe90,
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  for (local_ac = 0; local_ac < in_R8D; local_ac = local_ac + 1) {
    this_00 = pstd::
              vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              ::operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                            *)(in_RDI + 2),(long)local_ac);
    PiecewiseConstant1D::Integral(this_00);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
              (in_stack_fffffffffffffe80,(float *)in_stack_fffffffffffffe78);
  }
  pstd::span<float_const>::
  span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  iVar2 = 1;
  Tuple2<pbrt::Point2,_float>::operator[](&local_20,1);
  Tuple2<pbrt::Point2,_float>::operator[](&TStack_18,iVar2);
  sVar1.ptr._4_4_ = in_ECX;
  sVar1.ptr._0_4_ = in_R8D;
  sVar1.n = (size_t)pTVar3;
  PiecewiseConstant1D::PiecewiseConstant1D
            (in_R9,sVar1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
             (Allocator)in_stack_ffffffffffffffc0.memoryResource);
  PiecewiseConstant1D::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffe70);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            (&in_stack_fffffffffffffe70->func);
  return;
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nu, int nv, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalV(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nu * (size_t)nv);
        pConditionalV.reserve(nv);
        for (int v = 0; v < nv; ++v)
            // Compute conditional sampling distribution for $\tilde{v}$
            pConditionalV.emplace_back(func.subspan(v * nu, nu), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{v}]$
        pstd::vector<Float> marginalFunc;
        marginalFunc.reserve(nv);
        for (int v = 0; v < nv; ++v)
            marginalFunc.push_back(pConditionalV[v].Integral());
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }